

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O0

Array<const_FArrayBox_*,_3> * __thiscall amrex::EBFArrayBox::getEdgeCentData(EBFArrayBox *this)

{
  bool bVar1;
  CutFab *pCVar2;
  long in_RSI;
  MultiCutFab *in_RDI;
  Array<const_MultiCutFab_*,_3> *mfs;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  MultiCutFab *pMVar3;
  undefined1 local_28 [24];
  undefined1 *local_10;
  
  if ((*(long *)(in_RSI + 0x50) == 0) || (*(int *)(in_RSI + 0x58) < 0)) {
    pMVar3 = in_RDI;
    memset(in_RDI,0,0x18);
    (pMVar3->m_data).super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
    *(undefined8 *)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat = 0;
    *(undefined8 *)((long)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat.m_op + 4) = 0;
  }
  else {
    pMVar3 = in_RDI;
    EBFArrayBoxFactory::getEdgeCent((EBFArrayBoxFactory *)in_RDI);
    local_10 = local_28;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)pMVar3,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = MultiCutFab::ok(pMVar3,in_stack_ffffffffffffffbc);
    if (bVar1) {
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)pMVar3,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      pCVar2 = MultiCutFab::operator[](pMVar3,in_stack_ffffffffffffffbc);
      (pMVar3->m_data).super_FabArrayBase._vptr_FabArrayBase = (_func_int **)pCVar2;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)pMVar3,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      pCVar2 = MultiCutFab::operator[](pMVar3,in_stack_ffffffffffffffbc);
      *(CutFab **)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat = pCVar2;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)pMVar3,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      pCVar2 = MultiCutFab::operator[](pMVar3,in_stack_ffffffffffffffbc);
      *(CutFab **)((long)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat.m_op + 4) = pCVar2;
    }
    else {
      memset(pMVar3,0,0x18);
      (pMVar3->m_data).super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      *(undefined8 *)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat = 0;
      *(undefined8 *)((long)&(pMVar3->m_data).super_FabArrayBase.boxarray.m_bat.m_op + 4) = 0;
    }
  }
  return (Array<const_FArrayBox_*,_3> *)in_RDI;
}

Assistant:

Array<const FArrayBox*, AMREX_SPACEDIM>
EBFArrayBox::getEdgeCentData () const
{
    if (m_factory && m_box_index >= 0) {
        Array<MultiCutFab const*, AMREX_SPACEDIM> const& mfs = m_factory->getEdgeCent();
        if (mfs[0]->ok(m_box_index)) {
            return {AMREX_D_DECL(&((*mfs[0])[m_box_index]),
                                 &((*mfs[1])[m_box_index]),
                                 &((*mfs[2])[m_box_index]))};
        } else {
            return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
        }
    } else {
        return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
    }
}